

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BacktrackingTokenStream.h
# Opt level: O0

bool __thiscall
SGParser::BacktrackingTokenStream<SGParser::GenericToken>::ReleaseMarker
          (BacktrackingTokenStream<SGParser::GenericToken> *this,size_t markerIndex)

{
  bool bVar1;
  _Self local_38;
  _Self local_30;
  _Self local_28;
  iterator iMap;
  size_t markerIndex_local;
  BacktrackingTokenStream<SGParser::GenericToken> *this_local;
  
  iMap._M_node = (_Base_ptr)markerIndex;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_SGParser::BacktrackingTokenStream<SGParser::GenericToken>::StreamBlock_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_SGParser::BacktrackingTokenStream<SGParser::GenericToken>::StreamBlock_*>_>_>
       ::find(&this->Markers,(key_type_conflict *)&iMap);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_SGParser::BacktrackingTokenStream<SGParser::GenericToken>::StreamBlock_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_SGParser::BacktrackingTokenStream<SGParser::GenericToken>::StreamBlock_*>_>_>
       ::end(&this->Markers);
  bVar1 = std::operator==(&local_28,&local_30);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    local_38._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_SGParser::BacktrackingTokenStream<SGParser::GenericToken>::StreamBlock_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_SGParser::BacktrackingTokenStream<SGParser::GenericToken>::StreamBlock_*>_>_>
         ::begin(&this->Markers);
    bVar1 = std::operator==(&local_28,&local_38);
    if (bVar1) {
      std::
      map<unsigned_long,SGParser::BacktrackingTokenStream<SGParser::GenericToken>::StreamBlock*,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,SGParser::BacktrackingTokenStream<SGParser::GenericToken>::StreamBlock*>>>
      ::erase_abi_cxx11_((map<unsigned_long,SGParser::BacktrackingTokenStream<SGParser::GenericToken>::StreamBlock*,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,SGParser::BacktrackingTokenStream<SGParser::GenericToken>::StreamBlock*>>>
                          *)&this->Markers,(iterator)local_28._M_node);
      ReleaseExtraBuffers(this);
    }
    else {
      std::
      map<unsigned_long,SGParser::BacktrackingTokenStream<SGParser::GenericToken>::StreamBlock*,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,SGParser::BacktrackingTokenStream<SGParser::GenericToken>::StreamBlock*>>>
      ::erase_abi_cxx11_((map<unsigned_long,SGParser::BacktrackingTokenStream<SGParser::GenericToken>::StreamBlock*,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,SGParser::BacktrackingTokenStream<SGParser::GenericToken>::StreamBlock*>>>
                          *)&this->Markers,(iterator)local_28._M_node);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool BacktrackingTokenStream<Token>::ReleaseMarker(size_t markerIndex) {
    const auto iMap = Markers.find(markerIndex);
    // If not found, we fail
    if (iMap == Markers.end())
        return false;
    // Remove one marker of this value
    if (iMap == Markers.begin()) {
        Markers.erase(iMap);
        ReleaseExtraBuffers();
    } else
        Markers.erase(iMap);
    return true;
}